

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProceduralBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ProceduralBlockSyntax,slang::syntax::SyntaxKind&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,SyntaxKind *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          StatementSyntax *args_3)

{
  Token keyword;
  ProceduralBlockSyntax *pPVar1;
  ProceduralBlockSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  BumpAllocator *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pPVar1 = (ProceduralBlockSyntax *)
           allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  keyword.info = in_RSI;
  keyword.kind = (short)in_RDX;
  keyword._2_1_ = (char)((ulong)in_RDX >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  keyword.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::ProceduralBlockSyntax::ProceduralBlockSyntax
            (in_RCX,(SyntaxKind)((ulong)in_R8 >> 0x20),
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             (in_RCX->super_MemberSyntax).super_SyntaxNode.parent,keyword,
             *(StatementSyntax **)&(in_RCX->super_MemberSyntax).super_SyntaxNode);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }